

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O2

bool __thiscall
TimesAll<0,0,0>::propagate_xy_min<0,0>
          (TimesAll<0,0,0> *this,IntView<0> u,IntView<0> v,int64_t v_min,int64_t v_max,int64_t z_min
          ,int64_t z_max)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  Clause *this_00;
  Lit *pLVar4;
  IntVar *pIVar5;
  ulong uVar6;
  Clause *pCVar7;
  IntVar *pIVar8;
  long lVar9;
  
  pIVar5 = v.var;
  pIVar8 = u.var;
  if (v_max < 0) {
    if (z_min < 1) {
      uVar2 = ~(z_max + v_min);
LAB_0018be96:
      uVar2 = (long)uVar2 / -v_min;
    }
    else {
      uVar2 = (~v_max + z_max) / v_max;
    }
  }
  else if (v_min < 1) {
    uVar6 = -z_min;
    if (z_min < 1) {
      uVar6 = z_min;
    }
    if (z_max <= (long)uVar6) {
      uVar6 = z_max;
    }
    uVar2 = -z_max;
    if (SBORROW8(uVar6,-z_max) != (long)(uVar6 + z_max) < 0) {
      uVar2 = uVar6;
    }
  }
  else {
    if (z_min < 1) {
      uVar2 = ~z_min + v_min;
      goto LAB_0018be96;
    }
    uVar2 = ((z_min + v_max) - 1U) / (ulong)v_max;
  }
  lVar3 = (long)(pIVar8->min).v;
  pCVar7 = (Clause *)0x1;
  if (lVar3 < (long)uVar2) {
    if (so.lazy) {
      this_00 = Reason_new(5);
      iVar1 = (*(pIVar5->super_Var).super_Branching._vptr_Branching[8])(pIVar5);
      pLVar4 = Clause::operator[](this_00,1);
      pLVar4->x = iVar1;
      iVar1 = (*(pIVar5->super_Var).super_Branching._vptr_Branching[9])(pIVar5);
      pLVar4 = Clause::operator[](this_00,2);
      pLVar4->x = iVar1;
      iVar1 = (**(code **)(**(long **)(this + 0x38) + 0x40))();
      pLVar4 = Clause::operator[](this_00,3);
      pLVar4->x = iVar1;
      iVar1 = (**(code **)(**(long **)(this + 0x38) + 0x48))();
      pLVar4 = Clause::operator[](this_00,4);
      pLVar4->x = iVar1;
      lVar3 = (long)(pIVar8->min).v;
    }
    else {
      this_00 = (Clause *)0x0;
    }
    lVar9 = uVar2 + (uVar2 == 0);
    if (lVar3 < lVar9) {
      pCVar7 = (Clause *)0x0;
      if (so.lazy == false) {
        this_00 = pCVar7;
      }
      iVar1 = (*(pIVar8->super_Var).super_Branching._vptr_Branching[0xe])(pIVar8,lVar9,this_00,1);
      if ((char)iVar1 == '\0') goto LAB_0018bf6a;
    }
    pCVar7 = (Clause *)0x1;
  }
LAB_0018bf6a:
  return SUB81(pCVar7,0);
}

Assistant:

bool propagate_xy_min(IntView<U> u, IntView<V> v, const int64_t v_min, const int64_t v_max,
												const int64_t z_min, const int64_t z_max) {
		assert(z_min > 0 || z_max < 0);
		assert(v_min != 0 && v_max != 0);
		// The product z cannot be 0. Then x and y cannot be 0, too.
		// x >= ceil(z / y)
		int64_t u_min_new = 0;
		if (v_max < 0) {
			// Integer variable v is negative
			if (z_min > 0) {
				// Integer variable z is positive
				u_min_new = (z_max - v_max - 1) / v_max;
			} else {
				// Integer variable z is negative
				u_min_new = (-z_max - v_min - 1) / -v_min;
			}
		} else if (v_min > 0) {
			// Integer variable is positive
			if (z_min > 0) {
				// Integer variable z is positive
				u_min_new = (z_min + v_max - 1) / v_max;
			} else {
				// Integer variable z is negative
				u_min_new = (-z_min + v_min - 1) / -v_min;
			}
		} else {
			// The domain of integer variable v contains -1 and 1
			u_min_new = std::min(-1 * z_min, z_min);
			u_min_new = std::min(u_min_new, z_max);
			u_min_new = std::min(u_min_new, -1 * z_max);
		}

		if (u_min_new > u.getMin()) {
			// TODO Better explanation
			Clause* reason = nullptr;
			if (so.lazy) {
				reason = Reason_new(5);
				(*reason)[1] = v.getMinLit();
				(*reason)[2] = v.getMaxLit();
				(*reason)[3] = z.getMinLit();
				(*reason)[4] = z.getMaxLit();
			}
			setDom(u, setMin, (u_min_new == 0 ? 1 : u_min_new), reason);
		}

		return true;
	}